

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_expose.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int y_1;
  int x_1;
  int h;
  int w;
  int y;
  int x;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *display;
  int local_a0;
  int local_9c;
  int local_78 [2];
  undefined8 local_70;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  uVar5 = al_install_system(0x5020700,atexit);
  if ((uVar5 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_primitives_addon();
  al_init_image_addon();
  al_install_keyboard();
  al_install_mouse();
  init_platform_specific();
  al_set_new_display_flags(0x50);
  al_set_new_display_option(0x16,1);
  lVar6 = al_create_display(0x140,200);
  if (lVar6 == 0) {
    abort_example("Error creating display\n");
  }
  lVar7 = al_load_bitmap("data/mysha.pcx");
  if (lVar7 == 0) {
    abort_example("mysha.pcx not found or failed to load\n");
  }
  al_draw_bitmap(0,lVar7,0);
  al_flip_display();
  uVar8 = al_create_timer(0x3fb999999999999a);
  uVar9 = al_create_event_queue();
  uVar11 = uVar9;
  uVar10 = al_get_keyboard_event_source();
  al_register_event_source(uVar9,uVar10);
  uVar9 = uVar11;
  uVar10 = al_get_mouse_event_source();
  al_register_event_source(uVar11,uVar10);
  uVar11 = uVar9;
  uVar10 = al_get_display_event_source(lVar6);
  al_register_event_source(uVar9,uVar10);
  uVar9 = uVar11;
  uVar10 = al_get_timer_event_source(uVar8);
  al_register_event_source(uVar11,uVar10);
  al_start_timer(uVar8);
  while ((al_wait_for_event(uVar9,local_78), local_78[0] != 0x2a &&
         ((local_78[0] != 10 || (local_58 != 0x3b))))) {
    if (local_78[0] == 0x29) {
      al_acknowledge_resize(local_70);
    }
    iVar3 = local_54;
    iVar2 = local_58;
    iVar1 = local_5c;
    iVar4 = local_60;
    if (local_78[0] == 0x28) {
      al_set_blender(0,1);
      uVar8 = 0;
      uVar11 = al_map_rgba_f(0x3f800000);
      al_draw_filled_rectangle
                ((float)iVar4,(float)iVar1,(float)(iVar4 + iVar2),(float)(iVar1 + iVar3),uVar11,
                 uVar8);
      al_flip_display();
    }
    if (local_78[0] == 0x1e) {
      al_set_blender(0,2,3);
      for (local_a0 = 0; iVar4 = al_get_display_height(lVar6), local_a0 < iVar4;
          local_a0 = local_a0 + 200) {
        for (local_9c = 0; iVar4 = al_get_display_width(lVar6), local_9c < iVar4;
            local_9c = local_9c + 0x140) {
          uVar8 = 0x3f800000;
          uVar11 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3dcccccd);
          al_draw_tinted_bitmap(uVar11,uVar8,(float)local_9c,(float)local_a0,lVar7,0);
        }
      }
      al_flip_display();
    }
  }
  al_destroy_event_queue(uVar9);
  al_destroy_bitmap(lVar7);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bitmap;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_init_image_addon();
   al_install_keyboard();
   al_install_mouse();
   init_platform_specific();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   al_set_new_display_option(ALLEGRO_SINGLE_BUFFER, true, ALLEGRO_REQUIRE);
   display = al_create_display(320, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }

   bitmap = al_load_bitmap("data/mysha.pcx");
   if (!bitmap) {
      abort_example("mysha.pcx not found or failed to load\n");
   }
   al_draw_bitmap(bitmap, 0, 0, 0);
   al_flip_display();

   timer = al_create_timer(0.1);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (true) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE)
            break;
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         int x = event.display.x,
            y = event.display.y, 
            w = event.display.width,
            h = event.display.height;
         /* Draw a red rectangle over the damaged area. */
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
         al_draw_filled_rectangle(x, y, x + w, y + h, al_map_rgba_f(1, 0, 0, 1));
         al_flip_display();
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
         /* Slowly restore the original bitmap. */
         int x, y;
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ALPHA, ALLEGRO_INVERSE_ALPHA);
         for (y = 0; y < al_get_display_height(display); y += 200) {
            for (x = 0; x < al_get_display_width(display); x += 320) {
               al_draw_tinted_bitmap(bitmap, al_map_rgba_f(1, 1, 1, 0.1), x, y, 0);
            }
         }
         al_flip_display();
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(bitmap);

   return 0;
}